

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::Test_HtmlparserTest_TestFiles::Test_HtmlparserTest_TestFiles
          (Test_HtmlparserTest_TestFiles *this)

{
  value_type local_18;
  Test_HtmlparserTest_TestFiles *local_10;
  Test_HtmlparserTest_TestFiles *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(HtmlparserTest, TestFiles) {
  HtmlparserCppTest tester;
  for (vector<string>::const_iterator it = g_filenames.begin();
       it != g_filenames.end(); ++it) {
    tester.SetUp();
    tester.ValidateFile(*it);
    tester.TearDown();
  }
}